

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

int __thiscall
UnifiedRegex::CharSet<char16_t>::GetCompactEntries(CharSet<char16_t> *this,uint max,Char *entries)

{
  code *pcVar1;
  bool bVar2;
  Char CVar3;
  undefined4 *puVar4;
  uint *puVar5;
  uint local_34;
  uint local_30;
  uint i;
  Char *pCStack_28;
  uint count;
  Char *entries_local;
  CharSet<char16_t> *pCStack_18;
  uint max_local;
  CharSet<char16_t> *this_local;
  
  pCStack_28 = entries;
  entries_local._4_4_ = max;
  pCStack_18 = this;
  if (4 < max) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x589,"(max <= MaxCompact)","max <= MaxCompact");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IsCompact(this);
  if (bVar2) {
    local_30 = GetCompactLength(this);
    puVar5 = min<unsigned_int>((uint *)((long)&entries_local + 4),&local_30);
    i = *puVar5;
    for (local_34 = 0; local_34 < i; local_34 = local_34 + 1) {
      CVar3 = GetCompactChar(this,local_34);
      pCStack_28[local_34] = CVar3;
    }
    this_local._4_4_ = (int)(this->rep).compact.countPlusOne + -1;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int CharSet<char16>::GetCompactEntries(uint max, __out_ecount(max) Char* entries) const
    {
        Assert(max <= MaxCompact);
        if (!IsCompact())
            return -1;

        uint count = min(max, (uint)(this->GetCompactLength()));
        __analysis_assume(count <= max);
        for (uint i = 0; i < count; i++)
        {
            // Bug in oacr. it can't figure out count is less than or equal to max
#pragma warning(suppress: 22102)
            entries[i] = this->GetCompactChar(i);
        }
        return static_cast<int>(rep.compact.countPlusOne - 1);
    }